

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void * map_get(Map *map,void *key)

{
  undefined8 *puVar1;
  List *pLVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ListNode *local_38;
  ListNode *node;
  Elem *elem;
  List *els;
  void *key_local;
  Map *map_local;
  
  pLVar2 = map_get_(map,key);
  if (pLVar2 != (List *)0x0) {
    for (local_38 = pLVar2->head; local_38 != (ListNode *)0x0; local_38 = local_38->next) {
      puVar1 = (undefined8 *)local_38->data;
      uVar3 = hash(key);
      uVar4 = hash((void *)*puVar1);
      if (uVar3 == uVar4) {
        return (void *)puVar1[1];
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *map_get(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            return elem->value;
        }
        node = node->next;
    }
    return NULL;
}